

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcGeometricCurveSet,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcGeometricCurveSet *in;
  
  in = (IfcGeometricCurveSet *)operator_new(0x70);
  *(undefined ***)&(in->super_IfcGeometricSet).field_0x58 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x60 = 0;
  *(char **)&in->field_0x68 = "IfcGeometricCurveSet";
  Assimp::IFC::Schema_2x3::IfcGeometricSet::IfcGeometricSet
            ((IfcGeometricSet *)in,&PTR_construction_vtable_24__008a45c8);
  (in->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcGeometricCurveSet_008a4510;
  *(undefined ***)&(in->super_IfcGeometricSet).field_0x58 = &PTR__IfcGeometricCurveSet_008a45b0;
  *(undefined ***)
   &(in->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcGeometricCurveSet_008a4538;
  *(undefined ***)
   &(in->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcGeometricCurveSet_008a4560;
  *(undefined ***)&(in->super_IfcGeometricSet).field_0x48 = &PTR__IfcGeometricCurveSet_008a4588;
  GenericFill<Assimp::IFC::Schema_2x3::IfcGeometricCurveSet>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcGeometricSet).super_IfcGeometricRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }